

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O3

void pzshape::TPZShapeTriang::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int ord;
  int iVar6;
  int *piVar7;
  long *plVar8;
  long lVar9;
  bool bVar10;
  int transformation_index;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  TPZVec<double> *pt_00;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  TPZManVector<double,_1> outvec;
  TPZVec<long> ids;
  TPZFNMatrix<50,_double> phiblend;
  TPZFNMatrix<100,_double> dphiblend;
  TPZVec<double> local_c90;
  double local_c70;
  _func_int **local_c68;
  _func_int **local_c60;
  _func_int **local_c58;
  _func_int **local_c50;
  _func_int **local_c48;
  TPZVec<long> *local_c40;
  TPZVec<double> *local_c38;
  double *local_c30;
  double *local_c28;
  _func_int **local_c20;
  ulong local_c18;
  TPZVec<long> local_c10;
  TPZFMatrix<double> local_bf0;
  double local_b60 [51];
  TPZFMatrix<double> local_9c8;
  double local_938 [101];
  TPZFMatrix<double> local_610;
  double local_580 [51];
  TPZFMatrix<double> local_3e8;
  double local_358 [101];
  
  local_c40 = id;
  local_c38 = pt;
  ShapeCorner(pt,phi,dphi);
  piVar7 = order->fStore;
  if ((((1 < *piVar7) || (1 < piVar7[1])) || (1 < piVar7[2])) || (2 < piVar7[3])) {
    local_610.fElem = local_580;
    local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 7;
    local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_c48 = (_func_int **)&PTR__TPZFMatrix_018b95f0;
    local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018b95f0;
    local_610.fSize = 0x32;
    local_610.fGiven = local_610.fElem;
    TPZVec<int>::TPZVec(&local_610.fPivot.super_TPZVec<int>,0);
    local_610.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_610.fPivot.super_TPZVec<int>.fStore = local_610.fPivot.fExtAlloc;
    local_610.fPivot.super_TPZVec<int>.fNElements = 0;
    local_610.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_610.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_610.fWork.fStore = (double *)0x0;
    local_610.fWork.fNElements = 0;
    local_610.fWork.fNAlloc = 0;
    local_c50 = (_func_int **)&PTR__TPZFNMatrix_018b9300;
    local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018b9300;
    local_3e8.fElem = local_358;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 7;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_c58 = (_func_int **)&PTR__TPZFMatrix_018379e0;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018379e0;
    local_3e8.fSize = 100;
    pt_00 = (TPZVec<double> *)&local_3e8.fPivot;
    local_3e8.fGiven = local_3e8.fElem;
    TPZVec<int>::TPZVec((TPZVec<int> *)pt_00,0);
    local_3e8.fPivot.super_TPZVec<int>.fStore = local_3e8.fPivot.fExtAlloc;
    local_3e8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_3e8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_3e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_3e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_3e8.fWork.fStore = (double *)0x0;
    local_3e8.fWork.fNElements = 0;
    local_3e8.fWork.fNAlloc = 0;
    local_c60 = (_func_int **)&PTR__TPZFNMatrix_018376f0;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018376f0;
    lVar19 = 0;
    do {
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar19) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar19) ||
         (local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_610.fElem[lVar19] = phi->fElem[lVar19];
      lVar20 = 0;
      bVar10 = true;
      do {
        bVar14 = bVar10;
        lVar16 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar16 <= lVar20) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar19)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar20) ||
           (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar19)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_3e8.fElem
        [local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar19 + lVar20] =
             dphi->fElem[lVar16 * lVar19 + lVar20];
        lVar20 = 1;
        bVar10 = false;
      } while (bVar14);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    ShapeGenerating(pt_00,&local_610,&local_3e8);
    local_c28 = local_b60;
    local_c30 = local_938;
    lVar19 = 3;
    local_c20 = (_func_int **)&PTR__TPZManVector_018b7c18;
    local_c68 = (_func_int **)&PTR__TPZVec_01813f30;
    uVar12 = 0;
    do {
      dVar1 = (double)(&gRibTrans2dT1d)[uVar12 * 2];
      dVar2 = (double)(&DAT_01a30e88)[uVar12 * 2];
      dVar3 = *local_c38->fStore;
      dVar4 = local_c38->fStore[1];
      dVar5 = (double)(&gVet1dT)[uVar12];
      TPZVec<double>::TPZVec(&local_c90,0);
      local_c70 = dVar5 + dVar1 * dVar3 + dVar2 * dVar4;
      local_c90._vptr_TPZVec = local_c20;
      local_c90.fStore = &local_c70;
      local_c90.fNElements = 1;
      local_c90.fNAlloc = 0;
      TPZVec<long>::TPZVec(&local_c10,2);
      plVar8 = local_c40->fStore;
      *local_c10.fStore = plVar8[uVar12];
      local_c18 = uVar12 + 1;
      uVar13 = local_c18 & 0xffffffff;
      if (local_c18 == 3) {
        uVar13 = 0;
      }
      local_c10.fStore[1] = plVar8[uVar13];
      iVar11 = order->fStore[uVar12];
      iVar6 = iVar11 + -1;
      uVar13 = (ulong)iVar6;
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c48;
      local_bf0.fElem = local_c28;
      local_bf0.fGiven = local_c28;
      local_bf0.fSize = 0x32;
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar13;
      TPZVec<int>::TPZVec(&local_bf0.fPivot.super_TPZVec<int>,0);
      local_bf0.fPivot.super_TPZVec<int>.fStore = local_bf0.fPivot.fExtAlloc;
      local_bf0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_bf0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_bf0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_bf0.fWork.fStore = (double *)0x0;
      local_bf0.fWork.fNElements = 0;
      local_bf0.fWork.fNAlloc = 0;
      local_bf0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      if (iVar6 == 0) {
        local_bf0.fElem = (double *)0x0;
      }
      else if (0x33 < iVar11) {
        local_bf0.fElem = (double *)operator_new__(uVar13 * 8);
      }
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c50;
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c58;
      local_9c8.fElem = local_c30;
      local_9c8.fGiven = local_c30;
      local_9c8.fSize = 100;
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar13;
      TPZVec<int>::TPZVec(&local_9c8.fPivot.super_TPZVec<int>,0);
      local_9c8.fPivot.super_TPZVec<int>.fStore = local_9c8.fPivot.fExtAlloc;
      local_9c8.fPivot.super_TPZVec<int>.fNElements = 0;
      local_9c8.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_9c8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_9c8.fWork.fStore = (double *)0x0;
      local_9c8.fWork.fNElements = 0;
      local_9c8.fWork.fNAlloc = 0;
      local_9c8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      if (iVar6 == 0) {
        local_9c8.fElem = (double *)0x0;
      }
      else if (0x33 < iVar11) {
        local_9c8.fElem = (double *)operator_new__(uVar13 << 4);
      }
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c60;
      ord = order->fStore[uVar12];
      transformation_index = TPZShapeLinear::GetTransformId1d(&local_c10);
      TPZShapeLinear::ShapeInternal(&local_c90,ord,&local_bf0,&local_9c8,transformation_index);
      TransformDerivativeFromRibToTriang((int)uVar12,iVar6,&local_9c8);
      if (1 < iVar11) {
        lVar20 = uVar12 + 3;
        lVar19 = (long)(int)lVar19;
        uVar18 = 0;
        do {
          if ((local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar20) ||
             (local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar18) ||
             (local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((lVar19 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar19))
             || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[lVar19] = local_610.fElem[uVar12 + 3] * local_bf0.fElem[uVar18];
          lVar16 = 0;
          bVar10 = true;
          do {
            bVar14 = bVar10;
            if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
               (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar20)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar18) ||
               (local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar20) ||
               (local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
               (local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar18)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if (((lVar9 <= lVar16) || (lVar19 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar19)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[lVar9 * lVar19 + lVar16] =
                 local_3e8.fElem
                 [local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar20 + lVar16] *
                 local_bf0.fElem[uVar18] +
                 local_610.fElem[uVar12 + 3] *
                 local_9c8.fElem
                 [local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar18 + lVar16];
            lVar16 = 1;
            bVar10 = false;
          } while (bVar14);
          lVar19 = lVar19 + 1;
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar13);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_9c8,&PTR_PTR_018379a8);
      TPZFMatrix<double>::~TPZFMatrix(&local_bf0,&PTR_PTR_018b95b8);
      local_c10._vptr_TPZVec = local_c68;
      if (local_c10.fStore != (long *)0x0) {
        operator_delete__(local_c10.fStore);
      }
      if (local_c90.fStore != &local_c70) {
        local_c90.fNAlloc = 0;
        local_c90._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        if (local_c90.fStore != (double *)0x0) {
          operator_delete__(local_c90.fStore);
        }
      }
      uVar12 = local_c18;
    } while (local_c18 != 3);
    iVar6 = order->fStore[3];
    if (2 < iVar6) {
      uVar15 = (iVar6 + -1) * (iVar6 + -2);
      uVar17 = uVar15 >> 1;
      uVar12 = (ulong)uVar17;
      local_bf0.fElem = local_b60;
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c48;
      local_bf0.fSize = 0x32;
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar12;
      local_bf0.fGiven = local_bf0.fElem;
      TPZVec<int>::TPZVec(&local_bf0.fPivot.super_TPZVec<int>,0);
      local_bf0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_bf0.fPivot.super_TPZVec<int>.fStore = local_bf0.fPivot.fExtAlloc;
      local_bf0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_bf0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_bf0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_bf0.fWork.fStore = (double *)0x0;
      local_bf0.fWork.fNElements = 0;
      local_bf0.fWork.fNAlloc = 0;
      if (0x65 < uVar15) {
        local_bf0.fElem = (double *)operator_new__(uVar12 * 8);
      }
      local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c50;
      local_9c8.fElem = local_938;
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c58;
      local_9c8.fSize = 100;
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar12;
      local_9c8.fGiven = local_9c8.fElem;
      TPZVec<int>::TPZVec(&local_9c8.fPivot.super_TPZVec<int>,0);
      local_9c8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_9c8.fPivot.super_TPZVec<int>.fStore = local_9c8.fPivot.fExtAlloc;
      local_9c8.fPivot.super_TPZVec<int>.fNElements = 0;
      local_9c8.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_9c8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_9c8.fWork.fStore = (double *)0x0;
      local_9c8.fWork.fNElements = 0;
      local_9c8.fWork.fNAlloc = 0;
      if (0x65 < uVar15) {
        local_9c8.fElem = (double *)operator_new__(uVar12 << 4);
      }
      local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           local_c60;
      iVar6 = order->fStore[3];
      iVar11 = GetTransformId2dT(local_c40);
      ShapeInternal(local_c38,iVar6 + -2,&local_bf0,&local_9c8,iVar11);
      if (1 < uVar15) {
        lVar19 = (long)(int)lVar19;
        uVar12 = 1;
        if (1 < uVar17) {
          uVar12 = (ulong)uVar17;
        }
        uVar13 = 0;
        do {
          if ((local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 7) ||
             (local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar13) ||
             (local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((lVar19 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar19))
             || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[lVar19] = local_610.fElem[6] * local_bf0.fElem[uVar13];
          lVar20 = 0;
          bVar10 = true;
          do {
            bVar14 = bVar10;
            if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar20) ||
               (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 7)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar13) ||
               (local_bf0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 7) ||
               (local_610.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar20) ||
               (local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar13)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar16 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if (((lVar16 <= lVar20) || (lVar19 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar19)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[lVar16 * lVar19 + lVar20] =
                 local_3e8.fElem
                 [local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 6 + lVar20] *
                 local_bf0.fElem[uVar13] +
                 local_610.fElem[6] *
                 local_9c8.fElem
                 [local_9c8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar13 + lVar20];
            lVar20 = 1;
            bVar10 = false;
          } while (bVar14);
          lVar19 = lVar19 + 1;
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar12);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_9c8,&PTR_PTR_018379a8);
      TPZFMatrix<double>::~TPZFMatrix(&local_bf0,&PTR_PTR_018b95b8);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_3e8,&PTR_PTR_018379a8);
    TPZFMatrix<double>::~TPZFMatrix(&local_610,&PTR_PTR_018b95b8);
  }
  return;
}

Assistant:

void TPZShapeTriang::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order,
							   TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		ShapeCorner(pt,phi,dphi);
		if (order[0] < 2 && order[1] < 2 && order[2] < 2 && order[3] < 3) return;
		int is,d;
    
        TPZFNMatrix<50,REAL> phiblend(NSides,1);
        TPZFNMatrix<100,REAL> dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		
		REAL out;
		int shape = 3;
		for (int rib = 0; rib < 3; rib++) {
			
			ProjectPoint2dTriangToRib(rib,pt,out);
			TPZManVector<REAL,1> outvec(1,out);
			TPZVec<int64_t> ids(2);
			ids[0] = id[rib%3];
			ids[1] = id[(rib+1)%3];
			int ord2 = order[rib]-1;//numero de shapes por lado rib
            TPZFNMatrix<50,REAL> phin(ord2,1);
            TPZFNMatrix<100,REAL>dphin(2,ord2);
			TPZShapeLinear *shplin=0;
			shplin->ShapeInternal(outvec,order[rib],phin,dphin,shplin->GetTransformId1d(ids));
//            dphin.Print("dphin= ",std::cout,EMathematicaInput);
			TransformDerivativeFromRibToTriang(rib,ord2,dphin);
			for (int i = 0; i < ord2; i++) {
				phi(shape,0) = phiblend(rib+3,0)*phin(i,0);
				for(int xj=0;xj<2;xj++) {
					dphi(xj,shape) = dphiblend(xj,rib+3)* phin( i, 0)+
					phiblend(rib+3, 0 )* dphin(xj,i);
				}
				shape++;
			}
		}
        
		if (order[3] < 3) return;//ordem na face
		int ord =  order[3]-2;//num de shapes da face
		int nsh = (ord*(ord+1))/2;
        TPZFNMatrix<50,REAL> phin(nsh,1);
        TPZFNMatrix<100,REAL> dphin(2,nsh);
		ShapeInternal(pt,order[3]-2, phin, dphin,GetTransformId2dT(id));
//         dphin.Print("dphin= ",std::cout,EMathematicaInput);
        
		for(int i=0;i<nsh;i++)	{//number of internal shape equal maximal order
			phi(shape,0) = phiblend(6,0)*phin(i,0);
			for(int d=0;d<2;d++) {
				dphi(d,shape) = dphiblend(d,6)* phin(i,0) +
				phiblend(6,0)*dphin(d,i);
			}
			shape++;
		}
	}